

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::MergeFrom(MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
            *this,MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
                  *other)

{
  double dVar1;
  value_type *key;
  double *pdVar2;
  const_iterator it;
  iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair> local_40;
  iterator_base<google::protobuf::Map<long,_double>::KeyValuePair> local_28;
  
  local_28.m_ = (other->map_).elements_;
  Map<long,_double>::InnerMap::iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>::
  SearchFrom(&local_28,(local_28.m_)->index_of_first_non_null_);
  local_40.node_ = local_28.node_;
  local_40.m_ = local_28.m_;
  local_40.bucket_index_ = local_28.bucket_index_;
  if (local_28.node_ != (Node *)0x0) {
    do {
      key = ((local_40.node_)->kv).v_;
      dVar1 = key->second;
      pdVar2 = Map<long,_double>::operator[](&this->map_,&key->first);
      *pdVar2 = dVar1;
      Map<long,_double>::InnerMap::
      iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>::operator++(&local_40);
    } while (local_40.node_ != (Node *)0x0);
  }
  return;
}

Assistant:

void MergeFrom(const MapFieldLite& other) {
    for (typename Map<Key, T>::const_iterator it = other.map_.begin();
         it != other.map_.end(); ++it) {
      map_[it->first] = it->second;
    }
  }